

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParseMod(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  undefined8 uVar1;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  if (chunklen % 10 != 0) {
    uVar1 = __cxa_allocate_exception(1);
    __cxa_throw(uVar1,&CBadForm::typeinfo,0);
  }
  skip_chunk(f,chunklen);
  return;
}

Assistant:

static void ParseMod(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// Section 7.4, page 23:
	//		It [the PMOD sub-chunk] is always a multiple of ten bytes in length,
	//		and contains zero or more modulators plus a terminal record
	if (chunklen % 10 != 0)
	{
		throw CBadForm();
	}
	// We've checked the length, now ignore the chunk.
	skip_chunk(f, chunklen);
}